

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp:108:50)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_error_object_cpp:108:50)>
       *this,model *to)

{
  gc_heap *pgVar1;
  
  to->_vptr_model = (_func_int **)&PTR_destroy_001d39d0;
  *(native_error_type *)&to[1]._vptr_model = (this->f).error_type;
  pgVar1 = (this->f).n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
  to[2]._vptr_model = (_func_int **)pgVar1;
  *(uint32_t *)&to[3]._vptr_model =
       (this->f).n.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)(to + 2));
  }
  pgVar1 = (this->f).prototype.super_gc_heap_ptr_untyped.heap_;
  to[4]._vptr_model = (_func_int **)pgVar1;
  *(uint32_t *)&to[5]._vptr_model = (this->f).prototype.super_gc_heap_ptr_untyped.pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)(to + 4));
  }
  pgVar1 = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  to[6]._vptr_model = (_func_int **)pgVar1;
  *(uint32_t *)&to[7]._vptr_model = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)(to + 6));
  }
  return;
}

Assistant:

void move(model* to) override { new (to) impl<F>(std::move(*this)); }